

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_FileLock)._vptr_FileLock = (_func_int **)&PTR__PosixFileLock_013bafe0;
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    FileLock::~FileLock(&this->super_FileLock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}